

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Random.cpp
# Opt level: O2

void amrex::RestoreRandomState(istream *is,int nthreads_old,int nstep_old)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  uVar3 = (uint)::(anonymous_namespace)::nthreads;
  if (nthreads_old <= (int)(uint)::(anonymous_namespace)::nthreads) {
    uVar3 = nthreads_old;
  }
  uVar4 = 0;
  uVar2 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 * 5000 - uVar4 != 0; uVar4 = uVar4 + 5000) {
    std::
    operator>><unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL,_char,_std::char_traits<char>_>
              (is,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                   *)(::(anonymous_namespace)::generators + uVar4));
  }
  uVar3 = (uint)::(anonymous_namespace)::nthreads;
  if (nthreads_old < (int)uVar3) {
    iVar1 = *(int *)(ParallelContext::frames + 0x10);
    lVar8 = (long)nthreads_old;
    lVar6 = iVar1 * lVar8 + (long)(*(int *)(ParallelContext::frames + 0xc) + 1);
    lVar5 = lVar8 * 5000;
    for (; lVar8 < (long)(ulong)uVar3; lVar8 = lVar8 + 1) {
      if ((ulong)(long)(int)(uVar3 * iVar1) < 0xffffffffffffffffU / (ulong)(long)(nstep_old + 1)) {
        lVar7 = (long)(int)(uVar3 * nstep_old * iVar1);
      }
      else {
        lVar7 = 0;
      }
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)(::(anonymous_namespace)::generators + lVar5),lVar7 + lVar6);
      uVar3 = (uint)::(anonymous_namespace)::nthreads;
      lVar6 = lVar6 + iVar1;
      lVar5 = lVar5 + 5000;
    }
  }
  return;
}

Assistant:

void
amrex::RestoreRandomState (std::istream& is, int nthreads_old, int nstep_old)
{
    int N = std::min(nthreads, nthreads_old);
    for (int i = 0; i < N; i++)
        is >> generators[i];
    if (nthreads > nthreads_old) {
        const int NProcs = ParallelDescriptor::NProcs();
        const int MyProc = ParallelDescriptor::MyProc();
        for (int i = nthreads_old; i < nthreads; i++) {
            amrex::ULong seed = MyProc+1 + i*NProcs;
            if (std::numeric_limits<amrex::ULong>::max()/(amrex::ULong)(nstep_old+1)
                > static_cast<amrex::ULong>(nthreads*NProcs)) // avoid overflow
            {
                seed += nstep_old*nthreads*NProcs;
            }

            generators[i].seed(seed);
        }
    }
}